

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall pfederc::BaseLogger::info(BaseLogger *this,string *msg)

{
  ostream *this_00;
  string *msg_local;
  BaseLogger *this_local;
  
  this_00 = std::operator<<(this->out,(string *)msg);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BaseLogger::info(const std::string &msg) noexcept {
  out << msg << std::endl;
}